

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

bool __thiscall
iDynTree::KinDynComputations::getFrameFreeFloatingJacobianSparsityPattern
          (KinDynComputations *this,FrameIndex frameIndex,MatrixView<double> *outJacobianPattern)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  index_type iVar4;
  long lVar5;
  long lVar6;
  double *pdVar7;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>_>
  *pDVar8;
  ScalarWithConstIfNotLvalue *pSVar9;
  MatrixView<double> *in_RDX;
  int iVar10;
  MatrixView<double> *in_RDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  size_t r;
  size_t c;
  SpatialMotionVector jointMotionSubspace;
  uint i;
  size_t dofOffset;
  IJointConstPtr joint;
  LinkIndex parentLinkIdx;
  LinkIndex visitedLinkIdx;
  Matrix6x6 genericAdjointTransform;
  LinkIndex jacobLink;
  bool ok;
  DenseBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffff9e8;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>_>
  *in_stack_fffffffffffff9f0;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>_>
  *in_stack_fffffffffffff9f8;
  SpatialVector<iDynTree::SpatialMotionVector> *in_stack_fffffffffffffa00;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>_>
  *in_stack_fffffffffffffa08;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_> *this_00;
  undefined4 in_stack_fffffffffffffa10;
  undefined4 in_stack_fffffffffffffa14;
  index_type in_stack_fffffffffffffa20;
  undefined7 in_stack_fffffffffffffa28;
  undefined1 uVar11;
  SpatialMotionVector *in_stack_fffffffffffffa78;
  undefined1 local_518 [216];
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>_>
  *local_440;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_> *local_358;
  SpatialVector<iDynTree::SpatialMotionVector> local_350;
  uint local_31c;
  undefined8 local_318;
  long *local_310;
  long local_308;
  long local_300;
  MatrixFixSize<6U,_6U> local_150;
  long local_30;
  undefined1 local_21;
  bool local_1;
  
  uVar3 = iDynTree::Model::isValidFrameIndex(in_RDI->m_rows + 8);
  if ((uVar3 & 1) == 0) {
    iDynTree::reportError("KinDynComputations","getFrameJacobian","Frame index out of bounds");
    local_1 = false;
  }
  else {
    iVar4 = MatrixView<double>::rows(in_RDX);
    uVar11 = false;
    if (iVar4 == 6) {
      in_stack_fffffffffffffa20 = MatrixView<double>::cols(in_RDX);
      lVar5 = iDynTree::Model::getNrOfDOFs();
      uVar11 = in_stack_fffffffffffffa20 == lVar5 + 6;
    }
    local_21 = uVar11;
    if ((bool)uVar11 == false) {
      iDynTree::reportError
                ("KinDynComputations","getFrameFreeJacobianSparsityPattern",
                 "Wrong size in input outJacobianPattern");
      local_1 = false;
    }
    else {
      local_30 = iDynTree::Model::getFrameLink(in_RDI->m_rows + 8);
      MatrixFixSize<6U,_6U>::MatrixFixSize(&local_150);
      MatrixFixSize<6U,_6U>::zero
                ((MatrixFixSize<6U,_6U> *)
                 CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
      toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_fffffffffffffa08);
      Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>::
      topLeftCorner<int,int>
                ((DenseBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                  *)in_stack_fffffffffffffa08,(int)((ulong)in_stack_fffffffffffffa00 >> 0x20),
                 (int)in_stack_fffffffffffffa00);
      Eigen::
      DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>_>
      ::setOnes((DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>
                 *)in_stack_fffffffffffff9f0);
      toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_fffffffffffffa08);
      Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>::
      topRightCorner<int,int>
                ((DenseBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                  *)CONCAT17(uVar11,in_stack_fffffffffffffa28),
                 (int)((ulong)in_stack_fffffffffffffa20 >> 0x20),(int)in_stack_fffffffffffffa20);
      Eigen::
      DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>_>
      ::setOnes((DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>
                 *)in_stack_fffffffffffff9f0);
      toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_fffffffffffffa08);
      Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>::
      bottomRightCorner<int,int>
                ((DenseBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                  *)in_RDI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX);
      Eigen::
      DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>_>
      ::setOnes((DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>
                 *)in_stack_fffffffffffff9f0);
      toEigen(in_RDI);
      Eigen::
      DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<-1,_-1>_>_>::
      setZero(in_stack_fffffffffffff9f0);
      toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_fffffffffffffa08);
      toEigen(in_RDI);
      Eigen::
      DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<-1,_-1>_>_>::
      leftCols<6>(in_stack_fffffffffffffa08,(Index)in_stack_fffffffffffffa00);
      Eigen::
      Block<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<-1,-1>>,-1,6,false>::
      operator=((Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_6,_false>
                 *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
      local_300 = local_30;
      while( true ) {
        lVar5 = local_300;
        iDynTree::Traversal::getBaseLink();
        lVar6 = iDynTree::Link::getIndex();
        if (lVar5 == lVar6) break;
        iDynTree::Traversal::getParentLinkFromLinkIndex(in_RDI->m_rows + 0x138);
        local_308 = iDynTree::Link::getIndex();
        local_310 = (long *)iDynTree::Traversal::getParentJointFromLinkIndex(in_RDI->m_rows + 0x138)
        ;
        local_318 = (**(code **)(*local_310 + 0xc0))();
        local_31c = 0;
        while( true ) {
          uVar2 = local_31c;
          uVar1 = (**(code **)(*local_310 + 0x20))();
          if (uVar1 <= uVar2) break;
          (**(code **)(*local_310 + 0x60))(&local_350,local_310,local_31c,local_300,local_308);
          local_358 = (MatrixBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                       *)0x0;
          while( true ) {
            this_00 = local_358;
            uVar2 = SpatialVector<iDynTree::SpatialMotionVector>::size(&local_350);
            if ((MatrixBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                 *)(ulong)uVar2 <= this_00) break;
            iVar10 = (int)&local_350;
            SpatialVector<iDynTree::SpatialMotionVector>::operator()
                      (in_stack_fffffffffffffa00,(uint)((ulong)in_stack_fffffffffffff9f8 >> 0x20));
            std::abs(iVar10);
            in_stack_fffffffffffffa00 =
                 (SpatialVector<iDynTree::SpatialMotionVector> *)
                 (~-(ulong)(extraout_XMM0_Qa < DEFAULT_TOL) & 0x3ff0000000000000);
            pdVar7 = SpatialVector<iDynTree::SpatialMotionVector>::operator()
                               (in_stack_fffffffffffffa00,
                                (uint)((ulong)in_stack_fffffffffffff9f8 >> 0x20));
            *pdVar7 = (double)in_stack_fffffffffffffa00;
            local_358 = local_358 + 1;
          }
          toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)this_00);
          toEigen(in_stack_fffffffffffffa78);
          Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>::
          operator*(this_00,(MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                            in_stack_fffffffffffffa00);
          toEigen(in_RDI);
          Eigen::
          DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<-1,_-1>_>_>
          ::col(in_stack_fffffffffffff9f8,(Index)in_stack_fffffffffffff9f0);
          Eigen::
          Block<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<-1,-1>>,-1,1,false>::
          operator=((Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>
                     *)in_stack_fffffffffffff9f0,
                    (DenseBase<Eigen::Product<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                     *)in_stack_fffffffffffff9e8);
          local_440 = (DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>_>
                       *)0x0;
          while( true ) {
            in_stack_fffffffffffff9f8 = local_440;
            toEigen(in_RDI);
            Eigen::
            DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<-1,_-1>_>_>
            ::col(in_stack_fffffffffffff9f8,(Index)in_stack_fffffffffffff9f0);
            pDVar8 = (DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>_>
                      *)Eigen::
                        EigenBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<-1,_-1>_>,_-1,_1,_false>_>
                        ::size((EigenBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>_>
                                *)in_stack_fffffffffffff9f0);
            if (pDVar8 <= in_stack_fffffffffffff9f8) break;
            toEigen(in_RDI);
            Eigen::
            DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<-1,_-1>_>_>
            ::col(in_stack_fffffffffffff9f8,(Index)in_stack_fffffffffffff9f0);
            iVar10 = (int)local_518;
            Eigen::
            MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<-1,_-1>_>,_-1,_1,_false>,_1>
            ::coeffRef((MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>,_1>
                        *)in_stack_fffffffffffffa00,(Index)in_stack_fffffffffffff9f8);
            std::abs(iVar10);
            in_stack_fffffffffffff9f0 =
                 (DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>_>
                  *)(~-(ulong)(extraout_XMM0_Qa_00 < DEFAULT_TOL) & 0x3ff0000000000000);
            toEigen(in_RDI);
            Eigen::
            DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<-1,_-1>_>_>
            ::col(in_stack_fffffffffffff9f8,(Index)in_stack_fffffffffffff9f0);
            pSVar9 = Eigen::
                     MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<-1,_-1>_>,_-1,_1,_false>,_1>
                     ::coeffRef((MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>,_1>
                                 *)in_stack_fffffffffffffa00,(Index)in_stack_fffffffffffff9f8);
            *pSVar9 = (ScalarWithConstIfNotLvalue)in_stack_fffffffffffff9f0;
            local_440 = local_440 + 1;
          }
          local_31c = local_31c + 1;
        }
        local_300 = local_308;
      }
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool KinDynComputations::getFrameFreeFloatingJacobianSparsityPattern(const FrameIndex frameIndex,
                                                                         MatrixView<double> outJacobianPattern) const
    {
        if (!pimpl->m_robot_model.isValidFrameIndex(frameIndex))
        {
            reportError("KinDynComputations","getFrameJacobian","Frame index out of bounds");
            return false;
        }

        bool ok = (outJacobianPattern.rows() == 6)
            && (outJacobianPattern.cols() == pimpl->m_robot_model.getNrOfDOFs() + 6);

        if( !ok )
        {
            reportError("KinDynComputations",
                        "getFrameFreeJacobianSparsityPattern",
                        "Wrong size in input outJacobianPattern");
            return false;
        }

        // Get the link to which the frame is attached
        LinkIndex jacobLink = pimpl->m_robot_model.getFrameLink(frameIndex);

        Matrix6x6 genericAdjointTransform;
        genericAdjointTransform.zero();
        // Set 1 to rotation matrix (top left)
        iDynTree::toEigen(genericAdjointTransform).topLeftCorner(3, 3).setOnes();
        // Set 1 to p \times R (top right)
        iDynTree::toEigen(genericAdjointTransform).topRightCorner(3, 3).setOnes();
        // Set 1 to rotation matrix (top left)
        iDynTree::toEigen(genericAdjointTransform).bottomRightCorner(3, 3).setOnes();

        // We zero the jacobian
        toEigen(outJacobianPattern).setZero();

        // Compute base part
        toEigen(outJacobianPattern).leftCols<6>() = toEigen(genericAdjointTransform);

        // Compute joint part
        // We iterate from the link up in the traveral until we reach the base
        LinkIndex visitedLinkIdx = jacobLink;

        while (visitedLinkIdx != pimpl->m_traversal.getBaseLink()->getIndex())
        {
            LinkIndex parentLinkIdx = pimpl->m_traversal.getParentLinkFromLinkIndex(visitedLinkIdx)->getIndex();
            IJointConstPtr joint = pimpl->m_traversal.getParentJointFromLinkIndex(visitedLinkIdx);

            size_t dofOffset = joint->getDOFsOffset();
            for (unsigned i = 0; i < joint->getNrOfDOFs(); ++i)
            {
                SpatialMotionVector jointMotionSubspace = joint->getMotionSubspaceVector(i, visitedLinkIdx, parentLinkIdx);
                // 1 or 0 in vector
                for (size_t c = 0; c < jointMotionSubspace.size(); ++c) {
                    jointMotionSubspace(c) = std::abs(jointMotionSubspace(c)) < iDynTree::DEFAULT_TOL ? 0.0 : 1.0;
                }
                toEigen(outJacobianPattern).col(6 + dofOffset + i) = toEigen(genericAdjointTransform) * toEigen(jointMotionSubspace);
                //have only 0 and 1 => divide component wise the column by itself
                for (size_t r = 0; r < toEigen(outJacobianPattern).col(6 + dofOffset + i).size(); ++r) {
                    toEigen(outJacobianPattern).col(6 + dofOffset + i).coeffRef(r) = std::abs(toEigen(outJacobianPattern).col(6 + dofOffset + i).coeffRef(r)) < iDynTree::DEFAULT_TOL ? 0.0 : 1.0;
                }
            }

            visitedLinkIdx = parentLinkIdx;
        }

        return true;
    }